

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)75,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  StrWriter *pSVar4;
  long lVar5;
  char cVar6;
  Ea<(moira::Mode)5,_(moira::Size)1> src;
  Ea<(moira::Mode)5,_(moira::Size)1> local_24;
  
  local_24.reg = op & 7;
  local_24.pc = *addr;
  *addr = local_24.pc + 2;
  local_24.ext1 = (*this->_vptr_Moira[5])();
  local_24.ext1 = local_24.ext1 & 0xffff;
  pcVar3 = "move";
  if (str->upper != false) {
    pcVar3 = "MOVE";
  }
  cVar6 = *pcVar3;
  while (cVar6 != '\0') {
    pcVar3 = pcVar3 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar6;
    cVar6 = *pcVar3;
  }
  iVar1 = (this->tab).raw;
  while (pcVar3 = str->ptr, pcVar3 < str->base + iVar1) {
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  pSVar4 = StrWriter::operator<<(str,&local_24);
  cVar6 = ',';
  lVar5 = 1;
  do {
    pcVar3 = pSVar4->ptr;
    pSVar4->ptr = pcVar3 + 1;
    *pcVar3 = cVar6;
    cVar6 = ", CCR"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,Byte> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src << ", CCR";
}